

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

float4x4 * ConvexDecomposition::MatrixRigidInverse(float4x4 *__return_storage_ptr__,float4x4 *m)

{
  float4x4 trans_inverse;
  float4x4 local_88;
  float4x4 local_48;
  
  local_48.w.x = -(m->w).x;
  local_48.w.y = -(m->w).y;
  local_48.w.z = -(m->w).z;
  local_48.x.x = 1.0;
  local_48.x._4_12_ = ZEXT812(0);
  local_48.y.x = 0;
  local_48.y.y = 1.0;
  local_48.z.z = 1.0;
  local_48.z.w = 0.0;
  local_48.w.w = 1.0;
  local_88.x.x = (m->x).x;
  local_88.y.x = (m->x).y;
  local_88.z.x = (m->x).z;
  local_88.w.x = (m->x).w;
  local_88.x.y = (m->y).x;
  local_88.y.y = (m->y).y;
  local_88.z.y = (m->y).z;
  local_88.w.y = (m->y).w;
  local_88.x.z = (m->z).x;
  local_88.y.z = (m->z).y;
  local_88.z.z = (m->z).z;
  local_88.w.z = (m->z).w;
  local_88.x.w = 0.0;
  local_88.y.w = 0.0;
  local_88.z.w = 0.0;
  local_88.w.w = 1.0;
  local_48._24_16_ = local_48._4_16_;
  operator*(__return_storage_ptr__,&local_48,&local_88);
  return __return_storage_ptr__;
}

Assistant:

float4x4 MatrixRigidInverse(const float4x4 &m)
{
	float4x4 trans_inverse = MatrixTranslation(-m.w.xyz());
	float4x4 rot   = m;
	rot.w = float4(0,0,0,1);
	return trans_inverse * MatrixTranspose(rot);
}